

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O2

uint CalculateCRC32(char *in)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  for (; *in != 0; in = (char *)((byte *)in + 1)) {
    uVar1 = uVar1 >> 8 ^ crc_32_tab[(byte)(*in ^ (byte)uVar1)];
  }
  return ~uVar1;
}

Assistant:

unsigned int CalculateCRC32(const char* in)
{
    unsigned int crc = (unsigned int)-1;
    while (*in != '\0')
    {
        crc = (crc >> 8) ^ crc_32_tab[(crc ^ *in) & 0xFF];
        in++;
    }
    return crc ^ (unsigned int)-1;
}